

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O0

void __thiscall
duckdb::TemplatedValidityMask<unsigned_long>::SetAllValid
          (TemplatedValidityMask<unsigned_long> *this,idx_t count)

{
  idx_t iVar1;
  ulong uVar2;
  idx_t in_RSI;
  TemplatedValidityMask<unsigned_long> *in_RDI;
  idx_t last_entry_bits;
  idx_t i;
  idx_t last_entry_index;
  ulong local_38;
  ulong local_20;
  
  EnsureWritable(in_RDI);
  if (in_RSI != 0) {
    iVar1 = TemplatedValidityData<unsigned_long>::EntryCount(in_RSI);
    uVar2 = iVar1 - 1;
    for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
      in_RDI->validity_mask[local_20] = 0xffffffffffffffff;
    }
    if ((in_RSI & 0x3f) == 0) {
      local_38 = 0xffffffffffffffff;
    }
    else {
      local_38 = -1L << (sbyte)(in_RSI & 0x3f) ^ 0xffffffffffffffff;
    }
    in_RDI->validity_mask[uVar2] = local_38 | in_RDI->validity_mask[uVar2];
  }
  return;
}

Assistant:

inline void SetAllValid(idx_t count) {
		EnsureWritable();
		if (count == 0) {
			return;
		}
		auto last_entry_index = ValidityBuffer::EntryCount(count) - 1;
		for (idx_t i = 0; i < last_entry_index; i++) {
			validity_mask[i] = ValidityBuffer::MAX_ENTRY;
		}
		auto last_entry_bits = count % BITS_PER_VALUE;
		validity_mask[last_entry_index] |= (last_entry_bits == 0)
		                                       ? ValidityBuffer::MAX_ENTRY
		                                       : ~static_cast<V>(ValidityBuffer::MAX_ENTRY << (last_entry_bits));
	}